

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_18::NameGenerator::VisitAll<wabt::Tag>
          (NameGenerator *this,vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *items,
          offset_in_NameGenerator_to_subr func)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  const_reference ppTVar3;
  long in_RCX;
  long *plVar4;
  code *local_70;
  uint local_44;
  Index i;
  offset_in_NameGenerator_to_subr func_local;
  vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *items_local;
  NameGenerator *this_local;
  Result local_c;
  
  local_44 = 0;
  while( true ) {
    sVar2 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::size(items);
    if (sVar2 <= local_44) {
      Result::Result(&local_c,Ok);
      return (Result)local_c.enum_;
    }
    plVar4 = (long *)((long)&(this->super_DelegateNop).super_Delegate._vptr_Delegate + in_RCX);
    local_70 = (code *)func;
    if ((func & 1) != 0) {
      local_70 = *(code **)(*plVar4 + (func - 1));
    }
    ppTVar3 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::operator[]
                        (items,(ulong)local_44);
    result.enum_ = (*local_70)(plVar4,local_44,*ppTVar3);
    bVar1 = Failed(result);
    if (bVar1) break;
    local_44 = local_44 + 1;
  }
  Result::Result(&local_c,Error);
  return (Result)local_c.enum_;
}

Assistant:

Result NameGenerator::VisitAll(const std::vector<T*>& items,
                               Result (NameGenerator::*func)(Index, T*)) {
  for (Index i = 0; i < items.size(); ++i) {
    CHECK_RESULT((this->*func)(i, items[i]));
  }
  return Result::Ok;
}